

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O0

char * scan_quote(char *p)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  char *pcStack_18;
  int q;
  char *p_local;
  
  cVar1 = *p;
  pcStack_18 = p + 1;
  while( true ) {
    bVar3 = false;
    if (*pcStack_18 != '\0') {
      bVar3 = *pcStack_18 != cVar1;
    }
    if (!bVar3) break;
    iVar2 = is_esc(*pcStack_18);
    if ((iVar2 != 0) && (pcStack_18 = pcStack_18 + 1, *pcStack_18 == '\0')) {
      return pcStack_18;
    }
    pcStack_18 = pcStack_18 + 1;
  }
  if (*pcStack_18 == cVar1) {
    pcStack_18 = pcStack_18 + 1;
  }
  return pcStack_18;
}

Assistant:

static char *scan_quote(char *p) {
  int q = *p;

  p++;
  while (*p != '\0' && *p != q) {
    if (is_esc(*p)) {
      p++;
      if (*p == '\0') {
        return p;
      }
    }
    p++;
  }
  if (*p == q) {
    p++;
  }
  return p;
}